

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O1

void outputUString(UChar *s,int32_t len,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  char *pcVar1;
  UChar UVar2;
  long lVar3;
  long lVar4;
  
  if (s == (UChar *)0x0) {
    lVar3 = 0;
    do {
      pcVar1 = "*NULL*" + lVar3;
      lVar3 = lVar3 + 1;
      outputChar(*pcVar1,outBuf,outIx,capacity,indent);
    } while (lVar3 != 7);
  }
  else if (len == -1 || 0 < len) {
    lVar3 = 0;
    do {
      UVar2 = s[lVar3];
      lVar4 = 0xc;
      do {
        outputChar("0123456789abcdef"[(ushort)UVar2 >> ((byte)lVar4 & 0x3f) & 0xf],outBuf,outIx,
                   capacity,0);
        lVar4 = lVar4 + -4;
      } while (lVar4 != -4);
      outputChar(' ',outBuf,outIx,capacity,indent);
    } while (((len != -1) || (UVar2 != L'\0')) && (lVar3 = lVar3 + 1, len == -1 || (int)lVar3 < len)
            );
  }
  return;
}

Assistant:

static void outputUString(const UChar *s, int32_t len, 
                          char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i = 0;
    UChar   c;
    if (s==NULL) {
        outputString(NULL, outBuf, outIx, capacity, indent);
        return;
    }

    for (i=0; i<len || len==-1; i++) {
        c = s[i];
        outputHexBytes(c, 4, outBuf, outIx, capacity);
        outputChar(' ', outBuf, outIx, capacity, indent);
        if (len == -1 && c==0) {
            break;
        }
    }
}